

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O3

bool __thiscall llvm::yaml::Document::skip(Document *this)

{
  bool bVar1;
  Node *pNVar2;
  Token *pTVar3;
  Token TStack_48;
  
  if (*(char *)((long)(this->stream->scanner)._M_t.
                      super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                      .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false> + 0x4a) == '\0') {
    pNVar2 = this->Root;
    if (pNVar2 == (Node *)0x0) {
      pNVar2 = parseBlockNode(this);
      this->Root = pNVar2;
    }
    (*pNVar2->_vptr_Node[1])();
    pTVar3 = Scanner::peekNext((Scanner *)
                               (this->stream->scanner)._M_t.
                               super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                               .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>);
    if (pTVar3->Kind != TK_StreamEnd) {
      if (pTVar3->Kind == TK_DocumentEnd) {
        Scanner::getNext(&TStack_48,
                         (Scanner *)
                         (this->stream->scanner)._M_t.
                         super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                         .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)TStack_48.Value._M_dataplus._M_p != &TStack_48.Value.field_2) {
          operator_delete(TStack_48.Value._M_dataplus._M_p,
                          TStack_48.Value.field_2._M_allocated_capacity + 1);
        }
        bVar1 = skip(this);
        return bVar1;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool Document::skip()  {
  if (stream.scanner->failed())
    return false;
  if (!Root)
    getRoot();
  Root->skip();
  Token &T = peekNext();
  if (T.Kind == Token::TK_StreamEnd)
    return false;
  if (T.Kind == Token::TK_DocumentEnd) {
    getNext();
    return skip();
  }
  return true;
}